

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::mouseDoubleClickEvent(QTabBar *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QTabBarPrivate *position;
  QRect *pQVar4;
  QTabBar *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool isEventInCornerButtons;
  QTabBarPrivate *d;
  QPoint pos;
  int in_stack_ffffffffffffffac;
  byte local_4a;
  byte local_49;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  position = d_func((QTabBar *)0x6b2d5f);
  QSinglePointEvent::position((QSinglePointEvent *)0x6b2d7a);
  QPointF::toPoint((QPointF *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = QWidget::isHidden((QWidget *)0x6b2da6);
  if (!bVar2) {
    pQVar4 = QWidget::geometry((QWidget *)position->leftB);
    bVar3 = QRect::contains((QPoint *)pQVar4,true);
    local_49 = 1;
    if ((bVar3 & 1) != 0) goto LAB_006b2e21;
  }
  bVar2 = QWidget::isHidden((QWidget *)0x6b2de8);
  local_4a = 0;
  if (!bVar2) {
    pQVar4 = QWidget::geometry((QWidget *)position->rightB);
    local_4a = QRect::contains((QPoint *)pQVar4,true);
  }
  local_49 = local_4a;
LAB_006b2e21:
  if ((local_49 & 1) == 0) {
    tabAt(in_RSI,(QPoint *)position);
    tabBarDoubleClicked((QTabBar *)0x6b2e4d,in_stack_ffffffffffffffac);
  }
  (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTabBar);
    const QPoint pos = event->position().toPoint();
    const bool isEventInCornerButtons = (!d->leftB->isHidden() && d->leftB->geometry().contains(pos))
                                        || (!d->rightB->isHidden() && d->rightB->geometry().contains(pos));
    if (!isEventInCornerButtons)
        emit tabBarDoubleClicked(tabAt(pos));

    mousePressEvent(event);
}